

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O3

bool __thiscall trun::DynLibLinux::IsValidTestFunc(DynLibLinux *this,string *funcName)

{
  size_type sVar1;
  bool bVar2;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (funcName,"test_",0,5);
  if (sVar1 == 0) {
    bVar2 = true;
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (funcName,"_test_",0,6);
    bVar2 = sVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool DynLibLinux::IsValidTestFunc(std::string funcName) {
    // The function table is what really matters
    if (funcName.find("test_",0) == 0) {
        return true;
    }
    if (funcName.find("_test_",0) == 0) {
        return true;
    }
    return false;
}